

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjEncodeYUVPlanes(tjhandle handle,uchar *srcBuf,int width,int pitch,int height,int pixelFormat,
                     uchar **dstPlanes,int *strides,int subsamp,int flags)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  JDIMENSION JVar4;
  int iVar5;
  void *__ptr;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uchar *puVar15;
  JDIMENSION JVar16;
  tjinstance *this;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  char *pcVar20;
  long lVar21;
  uchar *_tmpbuf_aligned;
  size_t __n;
  int *piVar22;
  long *in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ulong uVar30;
  JSAMPROW *tmpbuf2 [10];
  JSAMPROW *outbuf [10];
  JSAMPROW *tmpbuf [10];
  JSAMPLE *_tmpbuf2 [10];
  JSAMPLE *_tmpbuf [10];
  int pw [10];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  JDIMENSION aJStack_58 [10];
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  if ((*(byte *)((long)handle + 0x600) & 1) == 0) {
    pcVar20 = "tjEncodeYUVPlanes(): Instance has not been initialized for compression";
    __n = 0x47;
LAB_0010b31a:
    memcpy((void *)((long)handle + 0x608),pcVar20,__n);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    memcpy((void *)(*in_FS_OFFSET + -0xd0),pcVar20,__n);
  }
  else if ((((dstPlanes == (uchar **)0x0 ||
              (0xb < (uint)pixelFormat ||
              ((height < 1 || srcBuf == (uchar *)0x0) || (pitch < 0 || width < 1)))) ||
            (5 < (uint)subsamp)) || (*dstPlanes == (uchar *)0x0)) ||
          ((subsamp != 3 && ((dstPlanes[1] == (uchar *)0x0 || (dstPlanes[2] == (uchar *)0x0)))))) {
    builtin_strncpy((char *)((long)handle + 0x618),"s(): Inv",8);
    builtin_strncpy((char *)((long)handle + 0x620),"alid arg",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
    builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
    *(undefined8 *)((long)handle + 0x626) = 0x746e656d756772;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    *(undefined8 *)((long)in_FS_OFFSET + -0xb2) = 0x746e656d756772;
    in_FS_OFFSET[-0x18] = 0x766e49203a292873;
    in_FS_OFFSET[-0x17] = 0x6772612064696c61;
    in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
    in_FS_OFFSET[-0x19] = 0x656e616c50565559;
  }
  else {
    if (pixelFormat == 0xb) {
      pcVar20 = "tjEncodeYUVPlanes(): Cannot generate YUV images from CMYK pixels";
      __n = 0x41;
      goto LAB_0010b31a;
    }
    if (pitch == 0) {
      pitch = tjPixelSize[(uint)pixelFormat] * width;
    }
    iVar3 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
    if (iVar3 != 0) goto LAB_0010b463;
    *(int *)((long)handle + 0x30) = width;
    *(int *)((long)handle + 0x34) = height;
    if ((flags & 8U) == 0) {
      if ((flags & 0x10U) != 0) {
        pcVar20 = "JSIMD_FORCESSE=1";
        goto LAB_0010b567;
      }
      if ((flags & 0x20U) != 0) {
        pcVar20 = "JSIMD_FORCESSE2=1";
        goto LAB_0010b567;
      }
    }
    else {
      pcVar20 = "JSIMD_FORCEMMX=1";
LAB_0010b567:
      putenv(pcVar20);
    }
    setCompDefaults((jpeg_compress_struct *)handle,pixelFormat,subsamp,-1,flags);
    if (*(int *)((long)handle + 0x24) == 100) {
      (**(code **)(*handle + 0x20))(handle);
      jinit_c_master_control((j_compress_ptr)handle,0);
      jinit_color_converter((j_compress_ptr)handle);
      jinit_downsampler((j_compress_ptr)handle);
      (*(code *)**(undefined8 **)((long)handle + 0x1d8))(handle);
      iVar3 = *(int *)((long)handle + 0x138);
      uVar14 = *(uint *)((long)handle + 0x13c);
      uVar9 = -uVar14 & (uVar14 + height) - 1;
      __ptr = malloc((long)(int)uVar9 << 3);
      auVar2 = _DAT_0015d0d0;
      if (__ptr == (void *)0x0) {
        builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
        builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
        builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
        builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
        builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
        builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb1),"ocation ",8);
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa9),"failure",8);
        in_FS_OFFSET[-0x18] = 0x6d654d203a292873;
        in_FS_OFFSET[-0x17] = 0x6f6c6c612079726f;
        in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
        in_FS_OFFSET[-0x19] = 0x656e616c50565559;
        __ptr = (void *)0x0;
        uVar14 = 0xffffffff;
      }
      else {
        uVar17 = (ulong)(uint)height;
        lVar21 = uVar17 - 1;
        auVar24._8_4_ = (int)lVar21;
        auVar24._0_8_ = lVar21;
        auVar24._12_4_ = (int)((ulong)lVar21 >> 0x20);
        auVar23._0_8_ = (long)pitch;
        auVar23._8_4_ = pitch;
        auVar23._12_4_ = pitch >> 0x1f;
        uVar18 = 0;
        auVar24 = auVar24 ^ _DAT_0015d0d0;
        auVar25._8_4_ = 0xffffffff;
        auVar25._0_8_ = 0xffffffffffffffff;
        auVar25._12_4_ = 0xffffffff;
        auVar27 = _DAT_0015d0c0;
        do {
          auVar28 = auVar27;
          if ((flags & 2U) != 0) {
            auVar28._0_8_ = SUB168(auVar27 ^ auVar25,0) + (ulong)(uint)height;
            auVar28._8_8_ = SUB168(auVar27 ^ auVar25,8) + (ulong)(uint)height;
          }
          auVar29 = auVar27 ^ auVar2;
          uVar30 = auVar28._8_8_;
          if ((bool)(~(auVar29._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar29._0_4_ ||
                      auVar24._4_4_ < auVar29._4_4_) & 1)) {
            *(uchar **)((long)__ptr + uVar18 * 8) =
                 srcBuf + (ulong)auVar28._0_4_ * (ulong)(uint)pitch +
                          ((auVar28._0_8_ >> 0x20) * (ulong)(uint)pitch +
                           (ulong)auVar28._0_4_ * (ulong)(uint)(pitch >> 0x1f) << 0x20);
          }
          if ((auVar29._12_4_ != auVar24._12_4_ || auVar29._8_4_ <= auVar24._8_4_) &&
              auVar29._12_4_ <= auVar24._12_4_) {
            *(uchar **)((long)__ptr + uVar18 * 8 + 8) =
                 srcBuf + (uVar30 & 0xffffffff) * (ulong)(uint)pitch +
                          ((uVar30 >> 0x20) * (ulong)(uint)pitch +
                           (uVar30 & 0xffffffff) * (auVar23._8_8_ >> 0x20) << 0x20);
          }
          auVar28 = _DAT_0015d0c0;
          uVar18 = uVar18 + 2;
          lVar21 = auVar27._8_8_;
          auVar27._0_8_ = auVar27._0_8_ + 2;
          auVar27._8_8_ = lVar21 + 2;
        } while ((height + 1U & 0xfffffffe) != uVar18);
        if (height < (int)uVar9) {
          uVar1 = *(undefined8 *)((long)__ptr + (ulong)(uint)height * 8 + -8);
          uVar10 = ~height + uVar9;
          auVar29._4_4_ = 0;
          auVar29._0_4_ = uVar10;
          auVar29._8_4_ = uVar10;
          auVar29._12_4_ = 0;
          uVar18 = 0;
          auVar29 = auVar29 ^ auVar2;
          do {
            auVar26._8_4_ = (int)uVar18;
            auVar26._0_8_ = uVar18;
            auVar26._12_4_ = (int)(uVar18 >> 0x20);
            auVar27 = (auVar26 | auVar28) ^ auVar2;
            if ((bool)(~(auVar27._4_4_ == auVar29._4_4_ && auVar29._0_4_ < auVar27._0_4_ ||
                        auVar29._4_4_ < auVar27._4_4_) & 1)) {
              *(undefined8 *)((long)__ptr + uVar18 * 8 + uVar17 * 8) = uVar1;
            }
            if ((auVar27._12_4_ != auVar29._12_4_ || auVar27._8_4_ <= auVar29._8_4_) &&
                auVar27._12_4_ <= auVar29._12_4_) {
              *(undefined8 *)((long)__ptr + uVar18 * 8 + uVar17 * 8 + 8) = uVar1;
            }
            uVar18 = uVar18 + 2;
          } while (((ulong)uVar10 + 2 & 0xfffffffffffffffe) != uVar18);
        }
        iVar13 = *(int *)((long)handle + 0x4c);
        if (0 < (long)iVar13) {
          lVar21 = *(long *)((long)handle + 0x58);
          lVar8 = 0;
          do {
            lVar19 = lVar8 * 0x60;
            uVar10 = *(uint *)(lVar21 + 8 + lVar19);
            iVar5 = *(int *)(lVar21 + 0x1c + lVar19);
            uVar12 = (uint)(iVar3 * 8 * iVar5) / uVar10 + 0x1f & 0xffffffe0;
            pvVar6 = malloc((ulong)(uVar12 * uVar14 + 0x20));
            *(void **)(local_a8 + lVar8 * 8) = pvVar6;
            if (pvVar6 == (void *)0x0) {
LAB_0010bbf6:
              builtin_strncpy((char *)((long)handle + 0x627),"ocation ",8);
              builtin_strncpy((char *)((long)handle + 0x62f),"failure",8);
              builtin_strncpy((char *)((long)handle + 0x618),"s(): Mem",8);
              builtin_strncpy((char *)((long)handle + 0x620),"ory allo",8);
              builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
              builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
              *(undefined4 *)((long)handle + 0x6d0) = 1;
              builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb1),"ocation ",8);
              builtin_strncpy((char *)((long)in_FS_OFFSET + -0xa9),"failure",8);
              in_FS_OFFSET[-0x18] = 0x6d654d203a292873;
              in_FS_OFFSET[-0x17] = 0x6f6c6c612079726f;
              in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
              in_FS_OFFSET[-0x19] = 0x656e616c50565559;
              goto LAB_0010bc4e;
            }
            pvVar7 = malloc((long)(int)uVar14 * 8);
            *(void **)(local_148 + lVar8 * 8) = pvVar7;
            if (pvVar7 == (void *)0x0) goto LAB_0010bbf6;
            if (0 < (int)uVar14) {
              uVar18 = 0;
              do {
                *(ulong *)((long)pvVar7 + uVar18 * 8) =
                     (ulong)(uVar12 * (int)uVar18) + ((long)pvVar6 + 0x1fU & 0xffffffffffffffe0);
                uVar18 = uVar18 + 1;
              } while (uVar14 != uVar18);
            }
            uVar12 = iVar5 * 8 + 0x1fU & 0xffffffe0;
            iVar5 = *(int *)(lVar19 + lVar21 + 0xc);
            pvVar6 = malloc((ulong)(iVar5 * uVar12 + 0x20));
            *(void **)(local_f8 + lVar8 * 8) = pvVar6;
            if (pvVar6 == (void *)0x0) goto LAB_0010bbf6;
            pvVar7 = malloc((long)iVar5 * 8);
            *(void **)(local_1e8 + lVar8 * 8) = pvVar7;
            if (pvVar7 == (void *)0x0) goto LAB_0010bbf6;
            if (0 < iVar5) {
              uVar11 = 0;
              lVar19 = 0;
              do {
                *(ulong *)((long)pvVar7 + lVar19 * 8) =
                     (ulong)uVar11 + ((long)pvVar6 + 0x1fU & 0xffffffffffffffe0);
                lVar19 = lVar19 + 1;
                uVar11 = uVar11 + uVar12;
              } while (iVar5 != lVar19);
            }
            JVar4 = (int)(uVar10 * (-iVar3 & (width + iVar3) - 1U)) / iVar3;
            aJStack_58[lVar8] = JVar4;
            uVar18 = (long)(int)(iVar5 * uVar9) / (long)(int)uVar14;
            iVar5 = (int)uVar18;
            pvVar6 = malloc((long)iVar5 << 3);
            *(void **)(local_198 + lVar8 * 8) = pvVar6;
            if (pvVar6 == (void *)0x0) goto LAB_0010bbf6;
            if (0 < iVar5) {
              puVar15 = dstPlanes[lVar8];
              uVar17 = 0;
              do {
                *(uchar **)((long)pvVar6 + uVar17 * 8) = puVar15;
                if ((strides == (int *)0x0) || (JVar16 = strides[lVar8], strides[lVar8] == 0)) {
                  JVar16 = JVar4;
                }
                puVar15 = puVar15 + (int)JVar16;
                uVar17 = uVar17 + 1;
              } while ((uVar18 & 0xffffffff) != uVar17);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != iVar13);
        }
        iVar3 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
        if (iVar3 == 0) {
          if (0 < (int)uVar9) {
            iVar3 = *(int *)((long)handle + 0x13c);
            iVar13 = 0;
            do {
              (**(code **)(*(long *)((long)handle + 0x1d8) + 8))
                        (handle,(void *)((long)__ptr + (long)iVar13 * 8),local_148,0,iVar3);
              (**(code **)(*(long *)((long)handle + 0x1e0) + 8))(handle,local_148,0,local_1e8,0);
              if (0 < *(int *)((long)handle + 0x4c)) {
                piVar22 = (int *)(*(long *)((long)handle + 0x58) + 0xc);
                lVar21 = 0;
                do {
                  jcopy_sample_rows(*(JSAMPARRAY *)(local_1e8 + lVar21 * 8),0,
                                    *(JSAMPARRAY *)(local_198 + lVar21 * 8),
                                    (*piVar22 * iVar13) / *(int *)((long)handle + 0x13c),*piVar22,
                                    aJStack_58[lVar21]);
                  lVar21 = lVar21 + 1;
                  piVar22 = piVar22 + 0x18;
                } while (lVar21 < *(int *)((long)handle + 0x4c));
              }
              iVar3 = *(int *)((long)handle + 0x13c);
              iVar13 = iVar13 + iVar3;
            } while (iVar13 < (int)uVar9);
          }
          *(int *)((long)handle + 0x130) = *(int *)((long)handle + 0x130) + height;
          jpeg_abort_compress((j_compress_ptr)handle);
          uVar14 = 0;
        }
        else {
LAB_0010bc4e:
          uVar14 = 0xffffffff;
        }
      }
      goto LAB_0010b468;
    }
    builtin_strncpy((char *)((long)handle + 0x628)," is in t",8);
    builtin_strncpy((char *)((long)handle + 0x630),"he wrong",8);
    builtin_strncpy((char *)((long)handle + 0x618),"s(): lib",8);
    builtin_strncpy((char *)((long)handle + 0x620),"jpeg API",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjEncode",8);
    builtin_strncpy((char *)((long)handle + 0x610),"YUVPlane",8);
    *(undefined8 *)((long)handle + 0x637) = 0x65746174732067;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    *(undefined8 *)((long)in_FS_OFFSET + -0xa1) = 0x65746174732067;
    in_FS_OFFSET[-0x16] = 0x74206e6920736920;
    in_FS_OFFSET[-0x15] = 0x676e6f7277206568;
    in_FS_OFFSET[-0x18] = 0x62696c203a292873;
    in_FS_OFFSET[-0x17] = 0x495041206765706a;
    in_FS_OFFSET[-0x1a] = 0x65646f636e456a74;
    in_FS_OFFSET[-0x19] = 0x656e616c50565559;
  }
LAB_0010b463:
  uVar14 = 0xffffffff;
  __ptr = (void *)0x0;
LAB_0010b468:
  if (100 < *(int *)((long)handle + 0x24)) {
    jpeg_abort_compress((j_compress_ptr)handle);
  }
  free(__ptr);
  lVar21 = 0;
  do {
    free(*(void **)(local_148 + lVar21 * 8));
    free(*(void **)(local_a8 + lVar21 * 8));
    free(*(void **)(local_1e8 + lVar21 * 8));
    free(*(void **)(local_f8 + lVar21 * 8));
    free(*(void **)(local_198 + lVar21 * 8));
    lVar21 = lVar21 + 1;
  } while (lVar21 != 10);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar14;
}

Assistant:

DLLEXPORT int tjEncodeYUVPlanes(tjhandle handle, const unsigned char *srcBuf,
                                int width, int pitch, int height,
                                int pixelFormat, unsigned char **dstPlanes,
                                int *strides, int subsamp, int flags)
{
  JSAMPROW *row_pointer = NULL;
  JSAMPLE *_tmpbuf[MAX_COMPONENTS], *_tmpbuf2[MAX_COMPONENTS];
  JSAMPROW *tmpbuf[MAX_COMPONENTS], *tmpbuf2[MAX_COMPONENTS];
  JSAMPROW *outbuf[MAX_COMPONENTS];
  int i, retval = 0, row, pw0, ph0, pw[MAX_COMPONENTS], ph[MAX_COMPONENTS];
  JSAMPLE *ptr;
  jpeg_component_info *compptr;

  GET_CINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  _tmpbuf[i] = NULL;
    tmpbuf2[i] = NULL;  _tmpbuf2[i] = NULL;  outbuf[i] = NULL;
  }

  if ((this->init & COMPRESS) == 0)
    THROW("tjEncodeYUVPlanes(): Instance has not been initialized for compression");

  if (srcBuf == NULL || width <= 0 || pitch < 0 || height <= 0 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF || !dstPlanes ||
      !dstPlanes[0] || subsamp < 0 || subsamp >= NUMSUBOPT)
    THROW("tjEncodeYUVPlanes(): Invalid argument");
  if (subsamp != TJSAMP_GRAY && (!dstPlanes[1] || !dstPlanes[2]))
    THROW("tjEncodeYUVPlanes(): Invalid argument");

  if (pixelFormat == TJPF_CMYK)
    THROW("tjEncodeYUVPlanes(): Cannot generate YUV images from CMYK pixels");

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  cinfo->image_width = width;
  cinfo->image_height = height;

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  setCompDefaults(cinfo, pixelFormat, subsamp, -1, flags);

  /* Execute only the parts of jpeg_start_compress() that we need.  If we
     were to call the whole jpeg_start_compress() function, then it would try
     to write the file headers, which could overflow the output buffer if the
     YUV image were very small. */
  if (cinfo->global_state != CSTATE_START)
    THROW("tjEncodeYUVPlanes(): libjpeg API is in the wrong state");
  (*cinfo->err->reset_error_mgr) ((j_common_ptr)cinfo);
  jinit_c_master_control(cinfo, FALSE);
  jinit_color_converter(cinfo);
  jinit_downsampler(cinfo);
  (*cinfo->cconvert->start_pass) (cinfo);

  pw0 = PAD(width, cinfo->max_h_samp_factor);
  ph0 = PAD(height, cinfo->max_v_samp_factor);

  if ((row_pointer = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph0)) == NULL)
    THROW("tjEncodeYUVPlanes(): Memory allocation failure");
  for (i = 0; i < height; i++) {
    if (flags & TJFLAG_BOTTOMUP)
      row_pointer[i] = (JSAMPROW)&srcBuf[(height - i - 1) * (size_t)pitch];
    else
      row_pointer[i] = (JSAMPROW)&srcBuf[i * (size_t)pitch];
  }
  if (height < ph0)
    for (i = height; i < ph0; i++) row_pointer[i] = row_pointer[height - 1];

  for (i = 0; i < cinfo->num_components; i++) {
    compptr = &cinfo->comp_info[i];
    _tmpbuf[i] = (JSAMPLE *)malloc(
      PAD((compptr->width_in_blocks * cinfo->max_h_samp_factor * DCTSIZE) /
          compptr->h_samp_factor, 32) *
      cinfo->max_v_samp_factor + 32);
    if (!_tmpbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    tmpbuf[i] =
      (JSAMPROW *)malloc(sizeof(JSAMPROW) * cinfo->max_v_samp_factor);
    if (!tmpbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < cinfo->max_v_samp_factor; row++) {
      unsigned char *_tmpbuf_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf[i], 32);

      tmpbuf[i][row] = &_tmpbuf_aligned[
        PAD((compptr->width_in_blocks * cinfo->max_h_samp_factor * DCTSIZE) /
            compptr->h_samp_factor, 32) * row];
    }
    _tmpbuf2[i] =
      (JSAMPLE *)malloc(PAD(compptr->width_in_blocks * DCTSIZE, 32) *
                        compptr->v_samp_factor + 32);
    if (!_tmpbuf2[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    tmpbuf2[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * compptr->v_samp_factor);
    if (!tmpbuf2[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    for (row = 0; row < compptr->v_samp_factor; row++) {
      unsigned char *_tmpbuf2_aligned =
        (unsigned char *)PAD((JUINTPTR)_tmpbuf2[i], 32);

      tmpbuf2[i][row] =
        &_tmpbuf2_aligned[PAD(compptr->width_in_blocks * DCTSIZE, 32) * row];
    }
    pw[i] = pw0 * compptr->h_samp_factor / cinfo->max_h_samp_factor;
    ph[i] = ph0 * compptr->v_samp_factor / cinfo->max_v_samp_factor;
    outbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i]);
    if (!outbuf[i])
      THROW("tjEncodeYUVPlanes(): Memory allocation failure");
    ptr = dstPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      outbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  for (row = 0; row < ph0; row += cinfo->max_v_samp_factor) {
    (*cinfo->cconvert->color_convert) (cinfo, &row_pointer[row], tmpbuf, 0,
                                       cinfo->max_v_samp_factor);
    (cinfo->downsample->downsample) (cinfo, tmpbuf, 0, tmpbuf2, 0);
    for (i = 0, compptr = cinfo->comp_info; i < cinfo->num_components;
         i++, compptr++)
      jcopy_sample_rows(tmpbuf2[i], 0, outbuf[i],
        row * compptr->v_samp_factor / cinfo->max_v_samp_factor,
        compptr->v_samp_factor, pw[i]);
  }
  cinfo->next_scanline += height;
  jpeg_abort_compress(cinfo);

bailout:
  if (cinfo->global_state > CSTATE_START) jpeg_abort_compress(cinfo);
  free(row_pointer);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(_tmpbuf[i]);
    free(tmpbuf2[i]);
    free(_tmpbuf2[i]);
    free(outbuf[i]);
  }
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}